

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O1

int erkStep_TakeStep(void *arkode_mem,realtype *dsmPtr,int *nflagPtr)

{
  realtype *c;
  N_Vector *X;
  ARKodeMem pAVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  ARKodeMem local_40;
  ARKodeERKStepMem local_38;
  
  *nflagPtr = 0;
  iVar2 = erkStep_AccessStepMem(arkode_mem,"erkStep_TakeStep",&local_40,&local_38);
  pAVar1 = local_40;
  if (iVar2 == 0) {
    if (1 < local_38->stages) {
      c = local_38->cvals;
      X = local_38->Xvecs;
      uVar4 = 1;
      do {
        pAVar1->tcur = local_38->B->c[uVar4] * pAVar1->h + pAVar1->tn;
        if (pAVar1->report != 0) {
          fprintf((FILE *)pAVar1->diagfp,"ERKStep  step  %li  %.16g  %i  %.16g\n",pAVar1->nst,
                  uVar4 & 0xffffffff);
        }
        uVar3 = 0;
        do {
          c[uVar3] = pAVar1->h * local_38->B->A[uVar4][uVar3];
          X[uVar3] = local_38->F[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
        c[uVar3] = 1.0;
        X[uVar3] = pAVar1->yn;
        iVar2 = N_VLinearCombination((int)uVar3 + 1,c,X,pAVar1->ycur);
        if (iVar2 != 0) {
          return -0x1c;
        }
        if ((pAVar1->ProcessStage != (ARKPostProcessFn)0x0) &&
           (iVar2 = (*pAVar1->ProcessStage)(pAVar1->tcur,pAVar1->ycur,pAVar1->user_data), iVar2 != 0
           )) {
          return -0x26;
        }
        iVar2 = (*local_38->f)(pAVar1->tcur,pAVar1->ycur,local_38->F[uVar4],pAVar1->user_data);
        local_38->nfe = local_38->nfe + 1;
        if (iVar2 < 0) {
          return -8;
        }
        if (iVar2 != 0) {
          return -0xb;
        }
        uVar4 = uVar4 + 1;
      } while ((long)uVar4 < (long)local_38->stages);
    }
    iVar2 = erkStep_ComputeSolutions(local_40,dsmPtr);
    if ((-1 < iVar2) && (iVar2 = 0, local_40->report != 0)) {
      fprintf((FILE *)local_40->diagfp,"ERKStep  etest  %li  %.16g  %.16g\n",local_40->h,*dsmPtr,
              local_40->nst);
    }
  }
  return iVar2;
}

Assistant:

int erkStep_TakeStep(void* arkode_mem, realtype *dsmPtr, int *nflagPtr)
{
  int retval, is, js, nvec;
  realtype* cvals;
  N_Vector* Xvecs;
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;

  /* initialize algebraic solver convergence flag to success */
  *nflagPtr = ARK_SUCCESS;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "erkStep_TakeStep",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

#ifdef SUNDIALS_DEBUG_PRINTVEC
  printf("    ERKStep step %li,  stage 0,  h = %"RSYM",  t_n = %"RSYM"\n",
         ark_mem->nst, ark_mem->h, ark_mem->tcur);
#endif

#ifdef SUNDIALS_DEBUG_PRINTVEC
  printf("    ERKStep stage 0 solution:\n");
  N_VPrint(ark_mem->ycur);
  printf("    ERKStep stage RHS F[0]:\n");
  N_VPrint(step_mem->F[0]);
#endif

  /* Loop over internal stages to the step; since the method is explicit
     the first stage RHS is just the full RHS from the start of the step */
  for (is=1; is<step_mem->stages; is++) {

    /* Set current stage time(s) */
    ark_mem->tcur = ark_mem->tn + step_mem->B->c[is]*ark_mem->h;

#ifdef SUNDIALS_DEBUG
    printf("    ERKStep step %li,  stage %i,  h = %"RSYM",  t_n = %"RSYM"\n",
           ark_mem->nst, is, ark_mem->h, ark_mem->tcur);
#endif

    /* Solver diagnostics reporting */
    if (ark_mem->report)
      fprintf(ark_mem->diagfp, "ERKStep  step  %li  %"RSYM"  %i  %"RSYM"\n",
              ark_mem->nst, ark_mem->h, is, ark_mem->tcur);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                       "ARKODE::erkStep_TakeStep", "start-step",
                       "step = %li, h = "RSYM", stage = %i, tcur = %"RSYM,
                       ark_mem->nst, ark_mem->h, is, ark_mem->tcur);
#endif

    /* Set ycur to current stage solution */
    nvec = 0;
    for (js=0; js<is; js++) {
      cvals[nvec] = ark_mem->h * step_mem->B->A[is][js];
      Xvecs[nvec] = step_mem->F[js];
      nvec += 1;
    }
    cvals[nvec] = ONE;
    Xvecs[nvec] = ark_mem->yn;
    nvec += 1;

    /*   call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, ark_mem->ycur);
    if (retval != 0) return(ARK_VECTOROP_ERR);

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL) {
      retval = ark_mem->ProcessStage(ark_mem->tcur,
                                     ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0) return(ARK_POSTPROCESS_STAGE_FAIL);
    }

    /* compute updated RHS */
    retval = step_mem->f(ark_mem->tcur, ark_mem->ycur,
                         step_mem->F[is], ark_mem->user_data);
    step_mem->nfe++;
    if (retval < 0)  return(ARK_RHSFUNC_FAIL);
    if (retval > 0)  return(ARK_UNREC_RHSFUNC_ERR);

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    ERKStep stage RHS F[%i]:\n",is);
    N_VPrint(step_mem->F[is]);
#endif

  } /* loop over stages */

  /* compute time-evolved solution (in ark_ycur), error estimate (in dsm) */
  retval = erkStep_ComputeSolutions(ark_mem, dsmPtr);
  if (retval < 0)  return(retval);

#ifdef SUNDIALS_DEBUG
  printf("    ERKStep error estimate = %"RSYM"\n", *dsmPtr);
#endif
#ifdef SUNDIALS_DEBUG_PRINTVEC
  printf("    ERKStep updated solution:\n");
  N_VPrint(ark_mem->ycur);
#endif

  /* Solver diagnostics reporting */
  if (ark_mem->report)
    fprintf(ark_mem->diagfp, "ERKStep  etest  %li  %"RSYM"  %"RSYM"\n",
            ark_mem->nst, ark_mem->h, *dsmPtr);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::erkStep_TakeStep", "error-test",
                     "step = %li, h = "RSYM", dsm = %"RSYM,
                     ark_mem->nst, ark_mem->h, *dsmPtr);
#endif

  return(ARK_SUCCESS);
}